

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_CheckIndex_Test::TestBody(ExprTest_CheckIndex_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionFailure *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  AssertionFailure *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  int in_stack_fffffffffffffd5c;
  char *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  Type in_stack_fffffffffffffd6c;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  char *in_stack_fffffffffffffd78;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Message *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  allocator<char> local_151;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8 [32];
  AssertionResult local_d8 [3];
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [32];
  AssertionResult local_80 [3];
  int local_50;
  byte local_4a;
  allocator<char> local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
  mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::allocator<char>::~allocator(&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                 (char (*) [118])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_50 = 2;
    }
    else {
      local_50 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_50 != 0) goto LAB_001190c4;
  }
  else {
LAB_001190c4:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    testing::AssertionResult::failure_message((AssertionResult *)0x1190e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
               (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd40);
    testing::Message::~Message((Message *)0x119143);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11919b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::allocator<char>::~allocator(&local_a1);
    local_a2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
    }
    if ((local_a2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                 (char (*) [117])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_50 = 3;
    }
    else {
      local_50 = 0;
    }
    std::__cxx11::string::~string(local_a0);
    if (local_50 != 0) goto LAB_0011951c;
  }
  else {
LAB_0011951c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    testing::AssertionResult::failure_message((AssertionResult *)0x119538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
               (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd40);
    testing::Message::~Message((Message *)0x11959b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1195f3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::allocator<char>::~allocator(&local_f9);
    local_fa = 0;
    in_stack_fffffffffffffdc7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffdc7) {
      mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
    }
    if ((local_fa & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                 (char (*) [116])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_50 = 4;
    }
    else {
      local_50 = 0;
    }
    std::__cxx11::string::~string(local_f8);
    if (local_50 != 0) goto LAB_0011995c;
  }
  else {
LAB_0011995c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    testing::AssertionResult::failure_message((AssertionResult *)0x119978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
               (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd40);
    testing::Message::~Message((Message *)0x1199d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119a2d);
  this_01 = &local_130;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)this_01);
  if (bVar1) {
    __s = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::allocator<char>::~allocator(&local_151);
    in_stack_fffffffffffffd77 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd77) {
      mp::internal::CheckIndex(in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (char (*) [117])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_50 = 5;
    std::__cxx11::string::~string(local_150);
    if (local_50 == 0) goto LAB_00119e33;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x119d8e);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
             (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x119deb);
LAB_00119e33:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119e40);
  return;
}

Assistant:

TEST_F(ExprTest, CheckIndex) {
  mp::internal::CheckIndex(0, 3);
  mp::internal::CheckIndex(2, 3);
  EXPECT_ASSERT(mp::internal::CheckIndex(-10, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(-1, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(3, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(10, 3), "invalid index");
}